

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetStaticLibraryFlags
          (cmLocalGenerator *this,string *flags,string *config,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  string *psVar1;
  char *pcVar2;
  ulong uVar3;
  undefined1 local_c8 [8];
  string name_1;
  string local_a0;
  undefined1 local_80 [8];
  string name;
  allocator local_49;
  string local_48;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *target_local;
  string *config_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  this_00 = this->Makefile;
  local_28 = target;
  target_local = (cmGeneratorTarget *)config;
  config_local = flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CMAKE_STATIC_LINKER_FLAGS",&local_49);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_48);
  (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "CMAKE_STATIC_LINKER_FLAGS_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)target_local
                  );
    psVar1 = config_local;
    pcVar2 = cmMakefile::GetSafeDefinition
                       (this->Makefile,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80);
    (*this->_vptr_cmLocalGenerator[7])(this,psVar1,pcVar2);
    std::__cxx11::string::~string((string *)local_80);
  }
  psVar1 = config_local;
  this_01 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"STATIC_LIBRARY_FLAGS",
             (allocator *)(name_1.field_2._M_local_buf + 0xf));
  pcVar2 = cmGeneratorTarget::GetProperty(this_01,&local_a0);
  (*this->_vptr_cmLocalGenerator[7])(this,psVar1,pcVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "STATIC_LIBRARY_FLAGS_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)target_local
                  );
    psVar1 = config_local;
    pcVar2 = cmGeneratorTarget::GetProperty
                       (local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_c8);
    (*this->_vptr_cmLocalGenerator[7])(this,psVar1,pcVar2);
    std::__cxx11::string::~string((string *)local_c8);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetStaticLibraryFlags(std::string& flags,
                                             std::string const& config,
                                             cmGeneratorTarget* target)
{
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_STATIC_LINKER_FLAGS"));
  if (!config.empty()) {
    std::string name = "CMAKE_STATIC_LINKER_FLAGS_" + config;
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(name));
  }
  this->AppendFlags(flags, target->GetProperty("STATIC_LIBRARY_FLAGS"));
  if (!config.empty()) {
    std::string name = "STATIC_LIBRARY_FLAGS_" + config;
    this->AppendFlags(flags, target->GetProperty(name));
  }
}